

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sysbvm_tuple_t sysbvm_filesystem_extension(sysbvm_context_t *context,sysbvm_tuple_t path)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = (path & 0xf) != 0;
  if ((!bVar5 && path != 0) && ((*(uint *)(path + 8) & 0x300) == 0x200)) {
    if (bVar5 || path == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)*(uint *)(path + 0xc);
    }
    uVar2 = uVar4;
    if (uVar4 != 0) {
      uVar3 = 0;
      do {
        if (*(char *)(path + 0x10 + uVar3) == '.') {
          uVar2 = uVar3;
        }
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
    sVar1 = sysbvm_string_createWithString(context,uVar4 - uVar2,(char *)(path + 0x10 + uVar2));
    return sVar1;
  }
  return path;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_extension(sysbvm_context_t *context, sysbvm_tuple_t path)
{
    if(!sysbvm_tuple_isBytes(path))
        return path;

    size_t pathSize = sysbvm_tuple_getSizeInBytes(path);
    uint8_t *pathBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(path)->bytes;
    size_t extensionStart = pathSize;
    for(size_t i = 0; i < pathSize; ++i)
    {
        char separator = pathBytes[i];
        if(separator == '.')
            extensionStart = i;
    }

    return sysbvm_string_createWithString(context, pathSize - extensionStart, (const char*)(pathBytes + extensionStart));
}